

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_settc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  long lVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  wchar_t lins;
  char *__format;
  FILE *__stream;
  termcapstr *t;
  long lVar7;
  char how [8];
  char what [8];
  char *ep;
  undefined4 local_50;
  EditLine *local_48;
  char local_40 [8];
  char *local_38;
  
  if (((argv != (wchar_t **)0x0) && (argv[1] != (wchar_t *)0x0)) && (argv[2] != (wchar_t *)0x0)) {
    pcVar3 = ct_encode_string(argv[1],&el->el_scratch);
    strlcpy(local_40,pcVar3,8);
    pcVar3 = ct_encode_string(argv[2],&el->el_scratch);
    strlcpy((char *)&local_50,pcVar3,8);
    t = tstr;
    pcVar3 = "al";
    do {
      iVar1 = strcmp(pcVar3,local_40);
      if (iVar1 == 0) {
        terminal_alloc(el,t,(char *)&local_50);
        goto LAB_00111b6d;
      }
      pcVar3 = t[1].name;
      t = t + 1;
    } while (pcVar3 != (char *)0x0);
    pcVar3 = "am";
    lVar7 = 0;
    uVar6 = 0;
    local_48 = el;
    do {
      iVar1 = strcmp(pcVar3,local_40);
      if (iVar1 == 0) {
        if (uVar6 < 0x20 || (uVar6 & 0x7fffffffffffffd0) == 0x40) {
          if (local_50 == 0x736579) {
            wVar2 = L'\x01';
          }
          else {
            if (local_50._2_1_ != '\0' || (short)local_50 != 0x6f6e) goto LAB_00111be4;
            wVar2 = L'\0';
          }
          (local_48->el_terminal).t_val[lVar7] = wVar2;
          el = local_48;
LAB_00111b6d:
          terminal_setflags(el);
        }
        else {
          lVar4 = strtol((char *)&local_50,&local_38,10);
          if (*local_38 != '\0') {
LAB_00111be4:
            __stream = (FILE *)local_48->el_errfile;
            pwVar5 = *argv;
            __format = "%ls: Bad value `%s\'.\n";
            pcVar3 = (char *)&local_50;
            goto LAB_00111bf7;
          }
          pwVar5 = (local_48->el_terminal).t_val;
          pwVar5[lVar7] = (wchar_t)lVar4;
          if (uVar6 == 0x20) {
            lins = pwVar5[2];
            (local_48->el_terminal).t_size.h = lins;
            wVar2 = pwVar5[3];
          }
          else {
            if (uVar6 != 0x30) {
              return L'\0';
            }
            wVar2 = pwVar5[3];
            (local_48->el_terminal).t_size.v = wVar2;
            lins = pwVar5[2];
          }
          wVar2 = terminal_change_size(local_48,lins,wVar2);
          if (wVar2 == L'\xffffffff') {
            return L'\xffffffff';
          }
        }
        return L'\0';
      }
      pcVar3 = *(char **)((long)&tval[1].name + uVar6);
      uVar6 = uVar6 + 0x10;
      lVar7 = lVar7 + 1;
    } while (pcVar3 != (char *)0x0);
    __stream = (FILE *)local_48->el_errfile;
    pwVar5 = *argv;
    __format = "%ls: Bad capability `%s\'.\n";
    pcVar3 = local_40;
LAB_00111bf7:
    fprintf(__stream,__format,pwVar5,pcVar3);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_settc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char what[8], how[8];
	long i;
	char *ep;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	strlcpy(what, ct_encode_string(argv[1], &el->el_scratch), sizeof(what));
	strlcpy(how,  ct_encode_string(argv[2], &el->el_scratch), sizeof(how));

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		terminal_alloc(el, ts, how);
		terminal_setflags(el);
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad capability `%s'.\n", argv[0], what);
		return -1;
	}

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		/*
		 * Booleans
		 */
		if (strcmp(how, "yes") == 0)
			el->el_terminal.t_val[tv - tval] = 1;
		else if (strcmp(how, "no") == 0)
			el->el_terminal.t_val[tv - tval] = 0;
		else {
			(void) fprintf(el->el_errfile,
			    "%ls: Bad value `%s'.\n", argv[0], how);
			return -1;
		}
		terminal_setflags(el);
		return 0;
	}

	/*
	 * Numerics
	 */
	i = strtol(how, &ep, 10);
	if (*ep != '\0') {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad value `%s'.\n", argv[0], how);
		return -1;
	}
	el->el_terminal.t_val[tv - tval] = (int) i;
	i = 0;
	if (tv == &tval[T_co]) {
		el->el_terminal.t_size.v = Val(T_co);
		i++;
	} else if (tv == &tval[T_li]) {
		el->el_terminal.t_size.h = Val(T_li);
		i++;
	}
	if (i && terminal_change_size(el, Val(T_li), Val(T_co)) == -1)
		return -1;
	return 0;
}